

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O1

DistanceType __thiscall
nanoflann::
KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
::computeInitialDistances
          (KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
           *this,KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
                 *obj,ElementType *vec,distance_vector_t *dists)

{
  long lVar1;
  double dVar2;
  double dVar3;
  
  if (vec != (ElementType *)0x0) {
    dVar2 = 0.0;
    lVar1 = 0;
    do {
      dVar3 = *(double *)
               ((long)&(obj->
                       super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
                       ).root_bbox._M_elems[0].low + lVar1 * 2);
      if (*(double *)((long)vec + lVar1) < dVar3) {
        dVar3 = *(double *)((long)vec + lVar1) - dVar3;
        dVar3 = dVar3 * dVar3;
        *(double *)((long)dists->_M_elems + lVar1) = dVar3;
        dVar2 = dVar2 + dVar3;
      }
      dVar3 = *(double *)
               ((long)&(obj->
                       super_KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
                       ).root_bbox._M_elems[0].high + lVar1 * 2);
      if (dVar3 < *(double *)((long)vec + lVar1)) {
        dVar3 = *(double *)((long)vec + lVar1) - dVar3;
        dVar3 = dVar3 * dVar3;
        *(double *)((long)dists->_M_elems + lVar1) = dVar3;
        dVar2 = dVar2 + dVar3;
      }
      lVar1 = lVar1 + 8;
    } while (lVar1 != 0x18);
    return dVar2;
  }
  __assert_fail("vec",
                "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/nanoflann/nanoflann.hpp"
                ,0x3f0,
                "DistanceType nanoflann::KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double, anurbs::PointOnSurfaceProjection<3>::PointCloudAdaptor>, anurbs::PointOnSurfaceProjection<3>::PointCloudAdaptor, 3>, nanoflann::L2_Simple_Adaptor<double, anurbs::PointOnSurfaceProjection<3>::PointCloudAdaptor>, anurbs::PointOnSurfaceProjection<3>::PointCloudAdaptor, 3>::computeInitialDistances(const Derived &, const ElementType *, distance_vector_t &) const [Derived = nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double, anurbs::PointOnSurfaceProjection<3>::PointCloudAdaptor>, anurbs::PointOnSurfaceProjection<3>::PointCloudAdaptor, 3>, Distance = nanoflann::L2_Simple_Adaptor<double, anurbs::PointOnSurfaceProjection<3>::PointCloudAdaptor>, DatasetAdaptor = anurbs::PointOnSurfaceProjection<3>::PointCloudAdaptor, DIM = 3, IndexType = unsigned long]"
               );
}

Assistant:

DistanceType computeInitialDistances(const Derived &obj,
                                       const ElementType *vec,
                                       distance_vector_t &dists) const {
    assert(vec);
    DistanceType distsq = DistanceType();

    for (int i = 0; i < (DIM > 0 ? DIM : obj.dim); ++i) {
      if (vec[i] < obj.root_bbox[i].low) {
        dists[i] = obj.distance.accum_dist(vec[i], obj.root_bbox[i].low, i);
        distsq += dists[i];
      }
      if (vec[i] > obj.root_bbox[i].high) {
        dists[i] = obj.distance.accum_dist(vec[i], obj.root_bbox[i].high, i);
        distsq += dists[i];
      }
    }
    return distsq;
  }